

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O3

int __thiscall P2PSocket::connect(P2PSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  int *piVar5;
  size_type *psVar6;
  long *plVar7;
  ulong *puVar8;
  undefined4 in_register_00000034;
  ulong *puVar9;
  undefined8 local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = Peers::connect(&this->m_peers,__fd,(sockaddr *)((ulong)__addr & 0xffff),__len);
  if ((char)iVar2 != '\0') {
    return iVar2;
  }
  plVar3 = (long *)__cxa_allocate_exception(0x20);
  std::operator+(&local_b0,"Failed to connect to: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000034,__fd));
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_d0._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar6) {
    local_d0.field_2._M_allocated_capacity = *psVar6;
    local_d0.field_2._8_8_ = plVar4[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar6;
  }
  local_d0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_70,(int)__addr);
  std::operator+(&local_50,&local_d0,&local_70);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar4;
  plVar7 = plVar4 + 2;
  if (local_90 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  piVar5 = __errno_location();
  strerror(*piVar5);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar8 = (ulong *)*plVar4;
  puVar9 = (ulong *)(plVar4 + 2);
  if (puVar8 == puVar9) {
    local_e0 = *puVar9;
    uStack_d8 = (undefined4)plVar4[3];
    uStack_d4 = *(undefined4 *)((long)plVar4 + 0x1c);
    puVar8 = &local_e0;
  }
  else {
    local_e0 = *puVar9;
  }
  lVar1 = plVar4[1];
  *plVar4 = (long)puVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  *plVar3 = (long)(plVar3 + 2);
  if (puVar8 == &local_e0) {
    *(undefined4 *)(plVar3 + 2) = (undefined4)local_e0;
    *(undefined4 *)((long)plVar3 + 0x14) = local_e0._4_4_;
    *(undefined4 *)(plVar3 + 3) = uStack_d8;
    *(undefined4 *)((long)plVar3 + 0x1c) = uStack_d4;
  }
  else {
    *plVar3 = (long)puVar8;
    plVar3[2] = local_e0;
  }
  plVar3[1] = lVar1;
  local_e0 = local_e0 & 0xffffffffffffff00;
  __cxa_throw(plVar3,&P2PSocketException::typeinfo,P2PSocketException::~P2PSocketException);
}

Assistant:

void P2PSocket::connect(const std::string &remotePeerAddress, int port)
{
    if (!this->m_peers.connect(remotePeerAddress, port)) {
        throw P2PSocketException(std::string{"Failed to connect to: " + remotePeerAddress + " " +
                                             std::to_string(port) + " "} +
                                 std::strerror(errno));
    }
}